

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

int vkt::ubo::anon_unknown_0::computeStd140BaseAlignment(VarType *type)

{
  int x;
  bool bVar1;
  DataType DVar2;
  deUint32 dVar3;
  int y;
  StructType *pSVar4;
  pointer this;
  VarType *pVVar5;
  int local_4c;
  __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
  local_40;
  __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
  local_38;
  ConstIterator memberIter;
  int maxBaseAlignment;
  int elemAlignment;
  int vecSize;
  bool isRowMajor;
  DataType basicType;
  int vec4Alignment;
  VarType *type_local;
  
  bVar1 = VarType::isBasicType(type);
  if (bVar1) {
    DVar2 = VarType::getBasicType(type);
    bVar1 = glu::isDataTypeMatrix(DVar2);
    if (bVar1) {
      dVar3 = VarType::getFlags(type);
      if ((dVar3 & 0x40) == 0) {
        local_4c = glu::getDataTypeMatrixNumRows(DVar2);
      }
      else {
        local_4c = glu::getDataTypeMatrixNumColumns(DVar2);
      }
      DVar2 = glu::getDataTypeFloatVec(local_4c);
      type_local._4_4_ = getDataTypeArrayStride(DVar2);
    }
    else {
      type_local._4_4_ = getDataTypeByteAlignment(DVar2);
    }
  }
  else {
    bVar1 = VarType::isArrayType(type);
    if (bVar1) {
      pVVar5 = VarType::getElementType(type);
      memberIter._M_current._4_4_ = computeStd140BaseAlignment(pVVar5);
      type_local._4_4_ = deRoundUp32(memberIter._M_current._4_4_,0x10);
    }
    else {
      memberIter._M_current._0_4_ = 0;
      pSVar4 = VarType::getStruct(type);
      local_38._M_current = (StructMember *)StructType::begin(pSVar4);
      while( true ) {
        pSVar4 = VarType::getStruct(type);
        local_40._M_current = (StructMember *)StructType::end(pSVar4);
        bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
        x = (int)memberIter._M_current;
        if (!bVar1) break;
        this = __gnu_cxx::
               __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
               ::operator->(&local_38);
        pVVar5 = StructMember::getType(this);
        y = computeStd140BaseAlignment(pVVar5);
        memberIter._M_current._0_4_ = de::max<int>(x,y);
        __gnu_cxx::
        __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
        ::operator++(&local_38,0);
      }
      type_local._4_4_ = deRoundUp32((int)memberIter._M_current,0x10);
    }
  }
  return type_local._4_4_;
}

Assistant:

int computeStd140BaseAlignment (const VarType& type)
{
	const int vec4Alignment = (int)sizeof(deUint32)*4;

	if (type.isBasicType())
	{
		glu::DataType basicType = type.getBasicType();

		if (glu::isDataTypeMatrix(basicType))
		{
			bool	isRowMajor	= !!(type.getFlags() & LAYOUT_ROW_MAJOR);
			int		vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
											 : glu::getDataTypeMatrixNumRows(basicType);

			return getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));
		}
		else
			return getDataTypeByteAlignment(basicType);
	}
	else if (type.isArrayType())
	{
		int elemAlignment = computeStd140BaseAlignment(type.getElementType());

		// Round up to alignment of vec4
		return deRoundUp32(elemAlignment, vec4Alignment);
	}
	else
	{
		DE_ASSERT(type.isStructType());

		int maxBaseAlignment = 0;

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
			maxBaseAlignment = de::max(maxBaseAlignment, computeStd140BaseAlignment(memberIter->getType()));

		return deRoundUp32(maxBaseAlignment, vec4Alignment);
	}
}